

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O1

void __thiscall UEFITool::goToBase(UEFITool *this)

{
  int iVar1;
  UINT32 base;
  long *plVar2;
  QModelIndex index;
  QModelIndex local_28;
  
  QWidget::setFocus((FocusReason)(this->goToBaseDialog->ui->super_Ui_GoToBaseDialog).hexSpinBox);
  QAbstractSpinBox::selectAll();
  iVar1 = (**(code **)(*(long *)this->goToBaseDialog + 0x1a8))();
  if (iVar1 == 1) {
    base = QSpinBox::value();
    TreeModel::findByBase(&local_28,this->model,base);
    if (((-1 < local_28.r) && (-1 < local_28.c)) && (local_28.m != (QAbstractItemModel *)0x0)) {
      (**(code **)(**(long **)(this->ui + 0x130) + 0x1e8))(*(long **)(this->ui + 0x130),&local_28,3)
      ;
      plVar2 = (long *)QAbstractItemView::selectionModel();
      (**(code **)(*plVar2 + 0x68))(plVar2,&local_28,0x23);
    }
  }
  return;
}

Assistant:

void UEFITool::goToBase()
{
    goToBaseDialog->ui->hexSpinBox->setFocus();
    goToBaseDialog->ui->hexSpinBox->selectAll();
    if (goToBaseDialog->exec() != QDialog::Accepted)
        return;
    
    UINT32 offset = (UINT32)goToBaseDialog->ui->hexSpinBox->value();
    QModelIndex index = model->findByBase(offset);
    if (index.isValid()) {
        ui->structureTreeView->scrollTo(index, QAbstractItemView::PositionAtCenter);
        ui->structureTreeView->selectionModel()->select(index, QItemSelectionModel::Select | QItemSelectionModel::Rows | QItemSelectionModel::Clear);
    }
}